

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-demo.cpp
# Opt level: O2

void __thiscall ExampleAppDocuments::ExampleAppDocuments(ExampleAppDocuments *this)

{
  MyDocument local_30;
  
  (this->Documents).Size = 0;
  (this->Documents).Capacity = 0;
  (this->Documents).Data = (MyDocument *)0x0;
  local_30.Name = "Lettuce";
  local_30.Open = true;
  local_30.OpenPrev = true;
  local_30.Dirty = false;
  local_30.WantClose = false;
  local_30.Color.x = 0.4;
  local_30.Color.y = 0.8;
  local_30.Color.z = 0.4;
  local_30.Color.w = 1.0;
  ImVector<MyDocument>::push_back(&this->Documents,&local_30);
  local_30.Name = "Eggplant";
  local_30.Open = true;
  local_30.OpenPrev = true;
  local_30.Dirty = false;
  local_30.WantClose = false;
  local_30.Color.x = 0.8;
  local_30.Color.y = 0.5;
  local_30.Color.z = 1.0;
  local_30.Color.w = 1.0;
  ImVector<MyDocument>::push_back(&this->Documents,&local_30);
  local_30.Name = "Carrot";
  local_30.Open = true;
  local_30.OpenPrev = true;
  local_30.Dirty = false;
  local_30.WantClose = false;
  local_30.Color.x = 1.0;
  local_30.Color.y = 0.8;
  local_30.Color.z = 0.5;
  local_30.Color.w = 1.0;
  ImVector<MyDocument>::push_back(&this->Documents,&local_30);
  local_30.Name = "Tomato";
  local_30.Open = false;
  local_30.OpenPrev = false;
  local_30.Dirty = false;
  local_30.WantClose = false;
  local_30.Color.x = 1.0;
  local_30.Color.y = 0.3;
  local_30.Color.z = 0.4;
  local_30.Color.w = 1.0;
  ImVector<MyDocument>::push_back(&this->Documents,&local_30);
  local_30.Name = "A Rather Long Title";
  local_30.Open = false;
  local_30.OpenPrev = false;
  local_30.Dirty = false;
  local_30.WantClose = false;
  local_30.Color.x = 1.0;
  local_30.Color.y = 1.0;
  local_30.Color.z = 1.0;
  local_30.Color.w = 1.0;
  ImVector<MyDocument>::push_back(&this->Documents,&local_30);
  local_30.Name = "Some Document";
  local_30.Open = false;
  local_30.OpenPrev = false;
  local_30.Dirty = false;
  local_30.WantClose = false;
  local_30.Color.x = 1.0;
  local_30.Color.y = 1.0;
  local_30.Color.z = 1.0;
  local_30.Color.w = 1.0;
  ImVector<MyDocument>::push_back(&this->Documents,&local_30);
  return;
}

Assistant:

ExampleAppDocuments()
    {
        Documents.push_back(MyDocument("Lettuce",             true,  ImVec4(0.4f, 0.8f, 0.4f, 1.0f)));
        Documents.push_back(MyDocument("Eggplant",            true,  ImVec4(0.8f, 0.5f, 1.0f, 1.0f)));
        Documents.push_back(MyDocument("Carrot",              true,  ImVec4(1.0f, 0.8f, 0.5f, 1.0f)));
        Documents.push_back(MyDocument("Tomato",              false, ImVec4(1.0f, 0.3f, 0.4f, 1.0f)));
        Documents.push_back(MyDocument("A Rather Long Title", false));
        Documents.push_back(MyDocument("Some Document",       false));
    }